

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_chunk_default_initialize
          (exr_context_t ctxt,int part_index,exr_attr_box2i_t *box,int levelx,int levely,
          exr_chunk_info_t *cinfo)

{
  long lVar1;
  exr_const_priv_part_t part_00;
  int *piVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  exr_storage_t tiley_00;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  int in_ECX;
  int iVar10;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int *in_R9;
  exr_attr_chlist_entry_t *curc;
  int c;
  int tiley;
  int tilex;
  int64_t dend;
  int64_t tend;
  uint64_t unpacksize;
  uint64_t texels;
  int tileh;
  int tilew;
  exr_attr_tiledesc_t *tiledesc;
  exr_attr_chlist_t *chanlist;
  exr_priv_part_t part;
  int lpc;
  int cidx;
  int miny;
  exr_attr_box2i_t dw;
  exr_result_t rv;
  int local_9c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  long lVar11;
  undefined8 in_stack_ffffffffffffff88;
  exr_const_context_t in_stack_ffffffffffffffa0;
  int local_4c;
  int local_44;
  int iVar12;
  uint uVar13;
  exr_result_t local_4;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_4 = 0;
  if (in_R9 == (int *)0x0) {
    local_4 = 3;
  }
  else if (in_RDX == (int *)0x0) {
    local_4 = 3;
  }
  else if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
    local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
    local_44 = (int)*(undefined8 *)(lVar1 + 0x90);
    iVar10 = (int)((ulong)*(undefined8 *)(lVar1 + 0x90) >> 0x20);
    iVar12 = (int)*(undefined8 *)(lVar1 + 0x98);
    uVar13 = (uint)((ulong)*(undefined8 *)(lVar1 + 0x98) >> 0x20);
    if ((in_RDX[1] < iVar10) || ((int)uVar13 < in_RDX[1])) {
      local_4 = 3;
    }
    else {
      if (*in_RDI == '\x04') {
        iVar3 = internal_exr_compute_chunk_offset_size((exr_priv_part_t)(ulong)uVar13);
        *(int32_t *)(lVar1 + 0xf4) = iVar3;
      }
      if (((*(int *)(lVar1 + 4) == 0) || (*(int *)(lVar1 + 4) == 2)) ||
         ((*in_RDI == '\x04' && (*(long *)(lVar1 + 0x60) == 0)))) {
        iVar4 = (int)*(short *)(lVar1 + 0xf0);
        local_4c = in_RDX[1] - iVar10;
        if (1 < iVar4) {
          local_4c = local_4c / iVar4;
        }
        iVar5 = iVar10 + local_4c * iVar4;
        if ((local_4c < 0) || (*(int *)(lVar1 + 0xf4) <= local_4c)) {
          local_4 = 3;
        }
        else {
          *in_R9 = local_4c;
          if ((*(int *)(lVar1 + 4) == 4) && (*in_RDI == '\x04')) {
            *(undefined1 *)((long)in_R9 + 0x16) = 0;
          }
          else {
            *(char *)((long)in_R9 + 0x16) = (char)*(undefined4 *)(lVar1 + 4);
          }
          *(char *)((long)in_R9 + 0x17) = (char)*(undefined4 *)(lVar1 + 0xb0);
          in_R9[1] = local_44;
          in_R9[2] = iVar5;
          in_R9[4] = (iVar12 - local_44) + 1;
          in_R9[3] = iVar4;
          if (iVar5 < iVar10) {
            in_R9[2] = iVar10;
            in_R9[3] = in_R9[3] - (iVar10 - iVar5);
          }
          else if ((long)(int)uVar13 < (long)iVar5 + (long)iVar4) {
            in_R9[3] = (uVar13 - iVar5) + 1;
          }
          *(undefined1 *)(in_R9 + 5) = 0;
          *(undefined1 *)((long)in_R9 + 0x15) = 0;
          uVar7 = compute_chunk_unpack_size
                            ((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             (int)in_stack_ffffffffffffff80,
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                             (int)in_stack_ffffffffffffff78,iVar6,
                             (exr_const_priv_part_t)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          *(uint64_t *)(in_R9 + 10) = uVar7;
        }
      }
      else if (*(long *)(lVar1 + 0x60) != 0) {
        lVar11 = 0;
        part_00 = *(exr_const_priv_part_t *)(*(long *)(lVar1 + 0x60) + 0x18);
        iVar6 = part_00->part_index;
        tiley_00 = part_00->storage_mode;
        iVar4 = (*in_RDX - local_44) / iVar6;
        iVar5 = (in_RDX[1] - iVar10) / (int)tiley_00;
        local_4 = validate_and_compute_tile_chunk_off
                            (in_stack_ffffffffffffffa0,part_00,iVar6,tiley_00,
                             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                             (int)in_stack_ffffffffffffff88,(int32_t *)CONCAT44(iVar12,iVar10));
        if (local_4 == 0) {
          lVar8 = (long)*(int *)(*(long *)(lVar1 + 0xd8) + (long)in_ECX * 4);
          lVar9 = (long)iVar6 * (long)(iVar4 + 1);
          if ((lVar8 < lVar9) && (lVar9 = lVar9 - lVar8, lVar9 < iVar6)) {
            iVar6 = iVar6 - (int)lVar9;
          }
          lVar8 = (long)*(int *)(*(long *)(lVar1 + 0xe0) + (long)in_R8D * 4);
          lVar9 = (long)(int)tiley_00 * (long)(iVar5 + 1);
          if ((lVar8 < lVar9) && (lVar9 = lVar9 - lVar8, lVar9 < (int)tiley_00)) {
            tiley_00 = tiley_00 - (int)lVar9;
          }
          *in_R9 = 0;
          if ((*(int *)(lVar1 + 4) == 4) && (*in_RDI == '\x04')) {
            *(undefined1 *)((long)in_R9 + 0x16) = 1;
          }
          else {
            *(char *)((long)in_R9 + 0x16) = (char)*(undefined4 *)(lVar1 + 4);
          }
          *(char *)((long)in_R9 + 0x17) = (char)*(undefined4 *)(lVar1 + 0xb0);
          in_R9[1] = iVar4;
          in_R9[2] = iVar5;
          in_R9[3] = tiley_00;
          in_R9[4] = iVar6;
          if ((in_ECX < 0x100) && (in_R8D < 0x100)) {
            *(char *)(in_R9 + 5) = (char)in_ECX;
            *(char *)((long)in_R9 + 0x15) = (char)in_R8D;
            piVar2 = *(int **)(*(long *)(lVar1 + 0x20) + 0x18);
            for (local_9c = 0; local_9c < *piVar2; local_9c = local_9c + 1) {
              iVar10 = 4;
              if (*(int *)(*(long *)(piVar2 + 2) + (long)local_9c * 0x20 + 0x10) == 1) {
                iVar10 = 2;
              }
              lVar11 = (long)iVar6 * (long)(int)tiley_00 * (long)iVar10 + lVar11;
            }
            *(long *)(in_R9 + 10) = lVar11;
          }
          else {
            local_4 = 0x11;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_chunk_default_initialize (
    exr_context_t ctxt, int part_index,
    const exr_attr_box2i_t *box,
    int levelx, int levely,
    exr_chunk_info_t* cinfo)
{
    exr_result_t     rv = EXR_ERR_SUCCESS;
    exr_attr_box2i_t dw;
    int              miny, cidx, lpc;
    exr_priv_part_t  part;

    if (!cinfo) return EXR_ERR_INVALID_ARGUMENT;
    if (!box) return EXR_ERR_INVALID_ARGUMENT;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (part_index < 0 || part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            part_index);

    /* TODO: Double check need for a lock? */
    part = ctxt->parts[part_index];

    dw = part->data_window;
    if (box->min.y < dw.min.y || box->min.y > dw.max.y)
        return EXR_ERR_INVALID_ARGUMENT;

    if (ctxt->mode == EXR_CONTEXT_TEMPORARY)
    {
        part->chunk_count = internal_exr_compute_chunk_offset_size (part);
    }

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        (ctxt->mode == EXR_CONTEXT_TEMPORARY && !(part->tiles)))
    {
        lpc  = part->lines_per_chunk;
        cidx = box->min.y - dw.min.y;
        if (lpc > 1) cidx /= lpc;

        // do we need to invert this when reading decreasing y? it appears not
        //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
        //    cidx = part->chunk_count - (cidx + 1);
        miny = dw.min.y + cidx * lpc;

        if (cidx < 0 || cidx >= part->chunk_count)
            return EXR_ERR_INVALID_ARGUMENT;

        cinfo->idx         = cidx;
        if (part->storage_mode == EXR_STORAGE_LAST_TYPE &&
            ctxt->mode == EXR_CONTEXT_TEMPORARY)
            cinfo->type = (uint8_t) EXR_STORAGE_SCANLINE;
        else
            cinfo->type = (uint8_t) part->storage_mode;
        cinfo->compression = (uint8_t) part->comp_type;
        cinfo->start_x     = dw.min.x;
        cinfo->start_y     = miny;
        cinfo->width       = dw.max.x - dw.min.x + 1;
        cinfo->height      = lpc;
        if (miny < dw.min.y)
        {
            cinfo->start_y = dw.min.y;
            cinfo->height -= dw.min.y - miny;
        }
        else if (((int64_t)miny + (int64_t)lpc) > (int64_t)dw.max.y)
        {
            cinfo->height = dw.max.y - miny + 1;
        }
        cinfo->level_x = 0;
        cinfo->level_y = 0;

        cinfo->unpacked_size = compute_chunk_unpack_size (
            dw.min.x, miny, cinfo->width, cinfo->height, lpc, part);
    }
    else if (part->tiles)
    {
        const exr_attr_chlist_t*   chanlist;
        const exr_attr_tiledesc_t* tiledesc;
        int                        tilew, tileh;
        uint64_t                   texels, unpacksize = 0;
        int64_t                    tend, dend;
        int                        tilex, tiley;

        tiledesc = part->tiles->tiledesc;

        tilew = (int) (tiledesc->x_size);
        tileh = (int) (tiledesc->y_size);

        tilex = (box->min.x - dw.min.x) / tilew;
        tiley = (box->min.y - dw.min.y) / tileh;

        cidx = 0;
        rv   = validate_and_compute_tile_chunk_off (
            ctxt, part, tilex, tiley, levelx, levely, &cidx);
        if (rv != EXR_ERR_SUCCESS) return rv;

        dend  = ((int64_t) part->tile_level_tile_size_x[levelx]);
        tend  = ((int64_t) tilew) * ((int64_t) (tilex + 1));
        if (tend > dend)
        {
            tend -= dend;
            if (tend < tilew) tilew = tilew - ((int) tend);
        }

        dend  = ((int64_t) part->tile_level_tile_size_y[levely]);
        tend  = ((int64_t) tileh) * ((int64_t) (tiley + 1));
        if (tend > dend)
        {
            tend -= dend;
            if (tend < tileh) tileh = tileh - ((int) tend);
        }

        cinfo->idx         = cidx;
        if (part->storage_mode == EXR_STORAGE_LAST_TYPE &&
            ctxt->mode == EXR_CONTEXT_TEMPORARY)
            cinfo->type = (uint8_t) EXR_STORAGE_TILED;
        else
            cinfo->type = (uint8_t) part->storage_mode;
        cinfo->compression = (uint8_t) part->comp_type;
        cinfo->start_x     = tilex;
        cinfo->start_y     = tiley;
        cinfo->height      = tileh;
        cinfo->width       = tilew;
        if (levelx > 255 || levely > 255)
            return EXR_ERR_ATTR_SIZE_MISMATCH;

        cinfo->level_x = (uint8_t) levelx;
        cinfo->level_y = (uint8_t) levely;

        chanlist = part->channels->chlist;
        texels   = (uint64_t) tilew * (uint64_t) tileh;
        for (int c = 0; c < chanlist->num_channels; ++c)
        {
            const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
            unpacksize +=
                texels * (uint64_t) ((curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4);
        }
        cinfo->unpacked_size = unpacksize;
    }

    return rv;
}